

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O0

MutableCodePointTrie *
icu_63::anon_unknown_0::MutableCodePointTrie::fromUCPTrie(UCPTrie *trie,UErrorCode *errorCode)

{
  char cVar1;
  UBool UVar2;
  MutableCodePointTrie *pMVar3;
  MutableCodePointTrie *local_68;
  uint32_t local_5c;
  uint32_t local_58;
  uint32_t value;
  UChar32 end;
  UChar32 start;
  undefined1 local_39;
  MutableCodePointTrie *local_38;
  LocalPointerBase<icu_63::(anonymous_namespace)::MutableCodePointTrie> local_30;
  LocalPointer<icu_63::(anonymous_namespace)::MutableCodePointTrie> mutableTrie;
  uint32_t initialValue;
  uint32_t errorValue;
  UErrorCode *errorCode_local;
  UCPTrie *trie_local;
  
  cVar1 = trie->valueWidth;
  if (cVar1 == '\0') {
    mutableTrie.super_LocalPointerBase<icu_63::(anonymous_namespace)::MutableCodePointTrie>.ptr.
    _4_4_ = (uint)*(ushort *)((long)(trie->data).ptr0 + (long)(trie->dataLength + -1) * 2);
    mutableTrie.super_LocalPointerBase<icu_63::(anonymous_namespace)::MutableCodePointTrie>.ptr.
    _0_4_ = (uint)*(ushort *)((long)(trie->data).ptr0 + (long)(trie->dataLength + -2) * 2);
  }
  else if (cVar1 == '\x01') {
    mutableTrie.super_LocalPointerBase<icu_63::(anonymous_namespace)::MutableCodePointTrie>.ptr.
    _4_4_ = *(uint *)((long)(trie->data).ptr0 + (long)(trie->dataLength + -1) * 4);
    mutableTrie.super_LocalPointerBase<icu_63::(anonymous_namespace)::MutableCodePointTrie>.ptr.
    _0_4_ = *(uint *)((long)(trie->data).ptr0 + (long)(trie->dataLength + -2) * 4);
  }
  else {
    if (cVar1 != '\x02') {
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
      return (MutableCodePointTrie *)0x0;
    }
    mutableTrie.super_LocalPointerBase<icu_63::(anonymous_namespace)::MutableCodePointTrie>.ptr.
    _4_4_ = (uint)*(byte *)((long)(trie->data).ptr0 + (long)(trie->dataLength + -1));
    mutableTrie.super_LocalPointerBase<icu_63::(anonymous_namespace)::MutableCodePointTrie>.ptr.
    _0_4_ = (uint)*(byte *)((long)(trie->data).ptr0 + (long)(trie->dataLength + -2));
  }
  pMVar3 = (MutableCodePointTrie *)UMemory::operator_new((UMemory *)0x11040,(size_t)errorCode);
  local_39 = 0;
  local_68 = (MutableCodePointTrie *)0x0;
  if (pMVar3 != (MutableCodePointTrie *)0x0) {
    local_39 = 1;
    local_38 = pMVar3;
    MutableCodePointTrie
              (pMVar3,(uint)mutableTrie.
                            super_LocalPointerBase<icu_63::(anonymous_namespace)::MutableCodePointTrie>
                            .ptr,
               mutableTrie.
               super_LocalPointerBase<icu_63::(anonymous_namespace)::MutableCodePointTrie>.ptr._4_4_
               ,errorCode);
    local_68 = pMVar3;
  }
  LocalPointer<icu_63::(anonymous_namespace)::MutableCodePointTrie>::LocalPointer
            ((LocalPointer<icu_63::(anonymous_namespace)::MutableCodePointTrie> *)&local_30,local_68
             ,errorCode);
  UVar2 = ::U_FAILURE(*errorCode);
  if (UVar2 == '\0') {
    value = 0;
    while (local_58 = ucptrie_getRange_63(trie,value,UCPMAP_RANGE_NORMAL,0,(UCPMapValueFilter *)0x0,
                                          (void *)0x0,&local_5c), -1 < (int)local_58) {
      if (local_5c !=
          (uint)mutableTrie.
                super_LocalPointerBase<icu_63::(anonymous_namespace)::MutableCodePointTrie>.ptr) {
        if (value == local_58) {
          pMVar3 = LocalPointerBase<icu_63::(anonymous_namespace)::MutableCodePointTrie>::operator->
                             (&local_30);
          set(pMVar3,value,local_5c,errorCode);
        }
        else {
          pMVar3 = LocalPointerBase<icu_63::(anonymous_namespace)::MutableCodePointTrie>::operator->
                             (&local_30);
          setRange(pMVar3,value,local_58,local_5c,errorCode);
        }
      }
      value = local_58 + 1;
    }
    UVar2 = ::U_SUCCESS(*errorCode);
    if (UVar2 == '\0') {
      trie_local = (UCPTrie *)0x0;
    }
    else {
      trie_local = (UCPTrie *)
                   LocalPointerBase<icu_63::(anonymous_namespace)::MutableCodePointTrie>::orphan
                             (&local_30);
    }
  }
  else {
    trie_local = (UCPTrie *)0x0;
  }
  end = 1;
  LocalPointer<icu_63::(anonymous_namespace)::MutableCodePointTrie>::~LocalPointer
            ((LocalPointer<icu_63::(anonymous_namespace)::MutableCodePointTrie> *)&local_30);
  return (MutableCodePointTrie *)trie_local;
}

Assistant:

MutableCodePointTrie *MutableCodePointTrie::fromUCPTrie(const UCPTrie *trie, UErrorCode &errorCode) {
    // Use the highValue as the initialValue to reduce the highStart.
    uint32_t errorValue;
    uint32_t initialValue;
    switch (trie->valueWidth) {
    case UCPTRIE_VALUE_BITS_16:
        errorValue = trie->data.ptr16[trie->dataLength - UCPTRIE_ERROR_VALUE_NEG_DATA_OFFSET];
        initialValue = trie->data.ptr16[trie->dataLength - UCPTRIE_HIGH_VALUE_NEG_DATA_OFFSET];
        break;
    case UCPTRIE_VALUE_BITS_32:
        errorValue = trie->data.ptr32[trie->dataLength - UCPTRIE_ERROR_VALUE_NEG_DATA_OFFSET];
        initialValue = trie->data.ptr32[trie->dataLength - UCPTRIE_HIGH_VALUE_NEG_DATA_OFFSET];
        break;
    case UCPTRIE_VALUE_BITS_8:
        errorValue = trie->data.ptr8[trie->dataLength - UCPTRIE_ERROR_VALUE_NEG_DATA_OFFSET];
        initialValue = trie->data.ptr8[trie->dataLength - UCPTRIE_HIGH_VALUE_NEG_DATA_OFFSET];
        break;
    default:
        // Unreachable if the trie is properly initialized.
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return nullptr;
    }
    LocalPointer<MutableCodePointTrie> mutableTrie(
        new MutableCodePointTrie(initialValue, errorValue, errorCode),
        errorCode);
    if (U_FAILURE(errorCode)) {
        return nullptr;
    }
    UChar32 start = 0, end;
    uint32_t value;
    while ((end = ucptrie_getRange(trie, start, UCPMAP_RANGE_NORMAL, 0,
                                   nullptr, nullptr, &value)) >= 0) {
        if (value != initialValue) {
            if (start == end) {
                mutableTrie->set(start, value, errorCode);
            } else {
                mutableTrie->setRange(start, end, value, errorCode);
            }
        }
        start = end + 1;
    }
    if (U_SUCCESS(errorCode)) {
        return mutableTrie.orphan();
    } else {
        return nullptr;
    }
}